

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR lyd_value_validate(ly_ctx *ctx,lysc_node *schema,char *value,size_t value_len,
                         lyd_node *ctx_node,lysc_type **realtype,char **canonical)

{
  bool bVar1;
  lysc_node *ctx_00;
  char *value_00;
  lysc_node *local_a8;
  bool local_8a;
  undefined1 local_88 [6];
  ly_bool log;
  ly_bool stored;
  lyd_value val;
  lysc_type *type;
  ly_err_item *err;
  lysc_type **pplStack_48;
  LY_ERR rc;
  lysc_type **realtype_local;
  lyd_node *ctx_node_local;
  size_t value_len_local;
  char *value_local;
  lysc_node *schema_local;
  ly_ctx *ctx_local;
  
  type = (lysc_type *)0x0;
  pplStack_48 = realtype;
  realtype_local = (lysc_type **)ctx_node;
  ctx_node_local = (lyd_node *)value_len;
  value_len_local = (size_t)value;
  value_local = (char *)schema;
  schema_local = (lysc_node *)ctx;
  memset(local_88,0,0x28);
  bVar1 = false;
  if (value_local == (char *)0x0) {
    ly_log((ly_ctx *)schema_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","schema",
           "lyd_value_validate");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((ctx_node_local == (lyd_node *)0x0) || (value_len_local != 0)) {
    local_8a = schema_local == (lysc_node *)0x0;
    if (local_8a) {
      schema_local = (lysc_node *)**(undefined8 **)(value_local + 8);
    }
    local_8a = !local_8a;
    if (ctx_node_local == (lyd_node *)0x0) {
      value_len_local = (long)"\t" + 1;
    }
    val.field_2._16_8_ = *(undefined8 *)(value_local + 0x60);
    err._4_4_ = (**(code **)(*(long *)(val.field_2._16_8_ + 0x10) + 8))
                          (schema_local,val.field_2._16_8_,value_len_local,ctx_node_local,0,4,0,
                           0x3f3,value_local,local_88,0,&type);
    if ((err._4_4_ == LY_SUCCESS) || (err._4_4_ == LY_EINCOMPLETE)) {
      bVar1 = true;
    }
    if ((realtype_local != (lysc_type **)0x0) && (err._4_4_ == LY_EINCOMPLETE)) {
      err._4_4_ = (**(code **)(*(long *)(val.field_2._16_8_ + 0x10) + 0x10))
                            (schema_local,val.field_2._16_8_,realtype_local,realtype_local,local_88,
                             &type);
    }
    if (((err._4_4_ != LY_SUCCESS) && (err._4_4_ != LY_EINCOMPLETE)) && (type != (lysc_type *)0x0))
    {
      if (local_8a) {
        ly_err_print_build_path
                  ((ly_ctx *)schema_local,(lyd_node *)realtype_local,(lysc_node *)value_local,
                   (ly_err_item *)type);
      }
      ly_err_free(type);
    }
    ctx_00 = schema_local;
    if ((err._4_4_ == LY_SUCCESS) || (err._4_4_ == LY_EINCOMPLETE)) {
      if (pplStack_48 != (lysc_type **)0x0) {
        if (*(int *)(val._canonical + 0x18) == 0xf) {
          *pplStack_48 = (lysc_type *)(val.realtype)->exts;
        }
        else {
          *pplStack_48 = (lysc_type *)val._canonical;
        }
      }
      if (canonical != (char **)0x0) {
        value_00 = (char *)(**(code **)(*(long *)(val._canonical + 0x10) + 0x28))
                                     (schema_local,local_88,0,0,0);
        lydict_insert((ly_ctx *)ctx_00,value_00,0,canonical);
      }
    }
    if (bVar1) {
      if (schema_local == (lysc_node *)0x0) {
        local_a8 = (lysc_node *)**(undefined8 **)(value_local + 8);
      }
      else {
        local_a8 = schema_local;
      }
      (**(code **)(*(long *)(val.field_2._16_8_ + 0x10) + 0x38))(local_a8,local_88);
    }
    ctx_local._4_4_ = err._4_4_;
  }
  else {
    ly_log((ly_ctx *)schema_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "!value_len || value","lyd_value_validate");
    ctx_local._4_4_ = LY_EINVAL;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_value_validate(const struct ly_ctx *ctx, const struct lysc_node *schema, const char *value, size_t value_len,
        const struct lyd_node *ctx_node, const struct lysc_type **realtype, const char **canonical)
{
    LY_ERR rc;
    struct ly_err_item *err = NULL;
    struct lysc_type *type;
    struct lyd_value val = {0};
    ly_bool stored = 0, log = 1;

    LY_CHECK_ARG_RET(ctx, schema, !value_len || value, LY_EINVAL);

    if (!ctx) {
        ctx = schema->module->ctx;
        log = 0;
    }
    if (!value_len) {
        value = "";
    }
    type = ((struct lysc_node_leaf *)schema)->type;

    /* store */
    rc = type->plugin->store(ctx, type, value, value_len, 0, LY_VALUE_JSON, NULL,
            LYD_HINT_DATA, schema, &val, NULL, &err);
    if (!rc || (rc == LY_EINCOMPLETE)) {
        stored = 1;
    }

    if (ctx_node && (rc == LY_EINCOMPLETE)) {
        /* resolve */
        rc = type->plugin->validate(ctx, type, ctx_node, ctx_node, &val, &err);
    }

    if (rc && (rc != LY_EINCOMPLETE) && err) {
        if (log) {
            /* log error */
            ly_err_print_build_path(ctx, ctx_node, schema, err);
        }
        ly_err_free(err);
    }

    if (!rc || (rc == LY_EINCOMPLETE)) {
        if (realtype) {
            /* return realtype */
            if (val.realtype->basetype == LY_TYPE_UNION) {
                *realtype = val.subvalue->value.realtype;
            } else {
                *realtype = val.realtype;
            }
        }

        if (canonical) {
            /* return canonical value */
            lydict_insert(ctx, val.realtype->plugin->print(ctx, &val, LY_VALUE_CANON, NULL, NULL, NULL), 0, canonical);
        }
    }

    if (stored) {
        /* free value */
        type->plugin->free(ctx ? ctx : schema->module->ctx, &val);
    }
    return rc;
}